

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_id_getter.cpp
# Opt level: O2

void __thiscall SharedIdGetter::put(SharedIdGetter *this,uid_t id)

{
  ContextManager *pCVar1;
  size_t *psVar2;
  _Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false> _Var3;
  size_t sVar4;
  unique_lock<SharedMutex> lock;
  unique_lock<SharedMutex> uStack_48;
  string local_38;
  
  std::unique_lock<SharedMutex>::unique_lock(&uStack_48,&this->mutex_);
  _Var3._M_head_impl =
       (this->ids_stack_)._M_t.
       super___uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
       .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl;
  psVar2 = ((this->stack_head_)._M_t.
            super___uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_SharedMemoryObject<unsigned_long>_*,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
            .super__Head_base<0UL,_SharedMemoryObject<unsigned_long>_*,_false>._M_head_impl)->ptr_;
  sVar4 = *psVar2;
  if (sVar4 == (_Var3._M_head_impl)->size_) {
    pCVar1 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Failed to put ID (%d): stack is full",id);
    (**pCVar1->_vptr_ContextManager)(pCVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    _Var3._M_head_impl =
         (this->ids_stack_)._M_t.
         super___uniq_ptr_impl<SharedMemoryArray<unsigned_int>,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_SharedMemoryArray<unsigned_int>_*,_std::default_delete<SharedMemoryArray<unsigned_int>_>_>
         .super__Head_base<0UL,_SharedMemoryArray<unsigned_int>_*,_false>._M_head_impl;
    psVar2 = ((this->stack_head_)._M_t.
              super___uniq_ptr_impl<SharedMemoryObject<unsigned_long>,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_SharedMemoryObject<unsigned_long>_*,_std::default_delete<SharedMemoryObject<unsigned_long>_>_>
              .super__Head_base<0UL,_SharedMemoryObject<unsigned_long>_*,_false>._M_head_impl)->ptr_
    ;
    sVar4 = *psVar2;
  }
  (_Var3._M_head_impl)->ptr_[sVar4] = id;
  *psVar2 = sVar4 + 1;
  std::unique_lock<SharedMutex>::~unique_lock(&uStack_48);
  return;
}

Assistant:

void SharedIdGetter::put(uid_t id) {
    std::unique_lock lock(mutex_);
    if (*stack_head_->get() == ids_stack_->size()) {
        die(format("Failed to put ID (%d): stack is full", id));
    }
    (*ids_stack_)[*stack_head_->get()] = id;
    (*stack_head_->get())++;
}